

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O3

bool __thiscall ON_LengthValue::Write(ON_LengthValue *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmAnonymousChunk(archive,1);
  if (!bVar1) {
    return false;
  }
  bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_length);
  if ((((bVar1) && (bVar1 = ON_UnitSystem::Write(&this->m_length_unit_system,archive), bVar1)) &&
      (bVar1 = ON_BinaryArchive::WriteInt(archive,(uint)this->m_context_angle_unit_system), bVar1))
     && (bVar1 = ON_BinaryArchive::WriteInt(archive,this->m_context_locale_id), bVar1)) {
    ON_wString::IsValid(&this->m_length_as_string,true);
    bVar1 = ON_BinaryArchive::WriteString(archive,&this->m_length_as_string);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteInt(archive,(uint)this->m_string_format);
      goto LAB_005c08ef;
    }
  }
  bVar1 = false;
LAB_005c08ef:
  bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_LengthValue::Write(
  class ON_BinaryArchive& archive
) const
{
  const int content_version = 1;
  if (!archive.BeginWrite3dmAnonymousChunk(content_version))
    return false;

  bool rc = false;
  for (;;)
  {
    // content version = 0
    if (!archive.WriteDouble(m_length))
      break;
    if (!m_length_unit_system.Write(archive))
      break;
    if (!archive.WriteInt(static_cast<unsigned int>(m_context_angle_unit_system)))
      break;
    if (!archive.WriteInt(m_context_locale_id))
      break;
    m_length_as_string.IsValid(true);
    if (!archive.WriteString(m_length_as_string))
      break;

    // content version 1 added m_string_format
    const unsigned int u = static_cast<unsigned char>(m_string_format);
    if (!archive.WriteInt(u))
      break;

    rc = true;
    break;
  }

  if (!archive.EndWrite3dmChunk())
    rc = false;
  return rc;
}